

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  undefined1 uVar1;
  bool bVar2;
  byte in_DIL;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  string c;
  char *in_stack_ffffffffffffff18;
  bool local_dd;
  bool local_db;
  string *suffix;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar3;
  undefined1 uVar4;
  string *this;
  undefined7 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  byte bVar5;
  byte bVar6;
  allocator<char> in_stack_ffffffffffffff67;
  string local_98 [37];
  byte local_73;
  byte local_72;
  undefined1 local_71 [40];
  undefined1 local_49;
  char *local_48;
  undefined8 local_30;
  string local_28 [38];
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  this = local_28;
  std::__cxx11::string::string(this,(string *)FLAGS_gtest_color_abi_cxx11_);
  local_30 = std::__cxx11::string::c_str();
  uVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x194ee2);
  if ((bool)uVar1) {
    local_48 = posix::GetEnv((char *)0x194f01);
    local_72 = 0;
    local_73 = 0;
    bVar6 = 0;
    bVar5 = 0;
    uVar4 = false;
    uVar3 = uVar4;
    if (local_48 != (char *)0x0) {
      bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x194f55);
      uVar3 = true;
      if (!bVar2) {
        bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x194f7a);
        uVar3 = true;
        if (!bVar2) {
          bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x194f9f);
          uVar3 = true;
          if (!bVar2) {
            bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x194fc4);
            uVar3 = true;
            if (!bVar2) {
              bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x194fe9);
              uVar3 = true;
              if (!bVar2) {
                bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x19500e);
                uVar3 = true;
                if (!bVar2) {
                  bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x195033);
                  uVar3 = true;
                  if (!bVar2) {
                    bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x195058);
                    uVar3 = true;
                    if (!bVar2) {
                      bVar2 = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x19507d);
                      uVar3 = true;
                      if (!bVar2) {
                        suffix = (string *)local_71;
                        std::allocator<char>::allocator();
                        local_72 = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff67,
                                               CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                                   (char *)CONCAT17(uVar1,in_stack_ffffffffffffff58),
                                   (allocator<char> *)this);
                        local_73 = 1;
                        std::allocator<char>::allocator();
                        bVar6 = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffff67,
                                               CONCAT16(1,CONCAT15(bVar5,CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                                   (char *)CONCAT17(uVar1,in_stack_ffffffffffffff58),
                                   (allocator<char> *)this);
                        bVar5 = 1;
                        uVar3 = String::EndsWithCaseInsensitive
                                          ((string *)
                                           CONCAT17(uVar4,CONCAT16(uVar3,in_stack_ffffffffffffff40))
                                           ,suffix);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((bVar5 & 1) != 0) {
      std::__cxx11::string::~string(local_98);
    }
    if ((bVar6 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    }
    if ((local_73 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_71 + 1));
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_71);
    }
    local_db = false;
    if ((local_2 & 1) != 0) {
      local_db = (bool)uVar3;
    }
    local_1 = local_db;
    local_49 = uVar3;
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x19527a);
    local_dd = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x1952a5);
      local_dd = true;
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff18,(char *)0x1952d0);
        local_dd = true;
        if (!bVar2) {
          local_dd = String::CStringEquals(in_stack_ffffffffffffff18,(char *)0x1952fb);
        }
      }
    }
    local_1 = local_dd;
  }
  std::__cxx11::string::~string(local_28);
  return (bool)(local_1 & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "alacritty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}